

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O0

column_t<relive::Track,_long,_const_long_&(relive::Track::*)()_const,_void_(relive::Track::*)(long)>
* sqlite_orm::make_column<relive::Track,long,void>(string *name,offset_in_Track_to_long m)

{
  undefined8 in_RDX;
  string *in_RSI;
  column_t<relive::Track,_long,_const_long_&(relive::Track::*)()_const,_void_(relive::Track::*)(long)>
  *in_RDI;
  undefined8 in_R9;
  string local_38 [32];
  undefined8 local_18;
  
  local_18 = in_RDX;
  std::__cxx11::string::string(local_38,in_RSI);
  std::make_tuple<>();
  internal::
  column_t<relive::Track,_long,_const_long_&(relive::Track::*)()_const,_void_(relive::Track::*)(long)>
  ::column_t(in_RDI,local_38,local_18,0,0,in_R9,0,0);
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

internal::column_t<O, T, const T &(O::*)() const, void (O::*)(T), Op...>
make_column(const std::string &name, T O::*m, Op... constraints) {
    static_assert(constraints::template constraints_size<Op...>::value == std::tuple_size<std::tuple<Op...>>::value,
                  "Incorrect constraints pack");
    static_assert(internal::is_field_member_pointer<T O::*>::value,
                  "second argument expected as a member field pointer, not member function pointer");
    return {name, m, nullptr, nullptr, std::make_tuple(constraints...)};
}